

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void dump_mpp_frame_to_file(MppFrame frame,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  RK_U8 *pRVar7;
  RK_U8 *pRVar8;
  RK_U32 RVar9;
  ulong uVar10;
  RK_U8 *pRVar11;
  ulong uVar12;
  RK_U8 *pRVar13;
  RK_U8 *base_y;
  bool bVar14;
  uint local_5c;
  
  if (frame == (MppFrame)0x0 || fp == (FILE *)0x0) {
    return;
  }
  uVar1 = mpp_frame_get_width();
  uVar10 = (ulong)uVar1;
  local_5c = mpp_frame_get_height(frame);
  uVar2 = mpp_frame_get_hor_stride(frame);
  iVar3 = mpp_frame_get_ver_stride(frame);
  uVar4 = mpp_frame_get_fmt(frame);
  lVar6 = mpp_frame_get_buffer(frame);
  if (lVar6 == 0) {
    return;
  }
  pRVar7 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(lVar6,"dump_mpp_frame_to_file");
  if ((uVar4 & 0xf0000) == 0x10000) {
    uVar5 = uVar4 & 0x1ffff;
    if ((uVar4 >> 0x18 & 1) == 0) {
      uVar5 = uVar4;
    }
    if ((uVar4 & 0x1ffff) < 0x10010) {
      uVar4 = uVar5;
    }
  }
  uVar5 = uVar4 & 0xfffff;
  switch(uVar5) {
  case 0:
  case 5:
    pRVar8 = pRVar7;
    uVar4 = local_5c;
    while (bVar14 = uVar4 != 0, uVar4 = uVar4 - 1, bVar14) {
      fwrite(pRVar8,1,uVar10,(FILE *)fp);
      pRVar8 = pRVar8 + uVar2;
    }
    pRVar7 = pRVar7 + iVar3 * uVar2;
    local_5c = local_5c >> 1;
    while (bVar14 = local_5c != 0, local_5c = local_5c - 1, bVar14) {
      fwrite(pRVar7,1,uVar10,(FILE *)fp);
      pRVar7 = pRVar7 + uVar2;
    }
    return;
  case 1:
    pRVar8 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file");
    if (pRVar8 == (RK_U8 *)0x0) {
LAB_00108070:
      _mpp_log_l(4,"utils","tmp_line malloc fail",0);
      return;
    }
    pRVar13 = pRVar7 + iVar3 * uVar2;
    uVar1 = uVar1 + 7 >> 3;
    for (uVar4 = 0; uVar4 != local_5c; uVar4 = uVar4 + 1) {
      for (RVar9 = 0; uVar1 != RVar9; RVar9 = RVar9 + 1) {
        rearrange_pix(pRVar8,pRVar7,RVar9);
      }
      fwrite(pRVar8,uVar10 * 2,1,(FILE *)fp);
      pRVar7 = pRVar7 + uVar2;
    }
    for (uVar4 = 0; uVar4 != local_5c >> 1; uVar4 = uVar4 + 1) {
      for (RVar9 = 0; uVar1 != RVar9; RVar9 = RVar9 + 1) {
        rearrange_pix(pRVar8,pRVar13,RVar9);
      }
      fwrite(pRVar8,uVar10 * 2,1,(FILE *)fp);
      pRVar13 = pRVar13 + uVar2;
    }
    break;
  case 2:
    pRVar8 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file");
    pRVar13 = pRVar7;
    uVar4 = local_5c;
    while (bVar14 = uVar4 != 0, uVar4 = uVar4 - 1, bVar14) {
      fwrite(pRVar13,1,uVar10,(FILE *)fp);
      pRVar13 = pRVar13 + uVar2;
    }
    pRVar7 = pRVar7 + iVar3 * uVar2;
    pRVar13 = pRVar8;
    for (uVar4 = 0; uVar4 != local_5c; uVar4 = uVar4 + 1) {
      for (uVar10 = 0; uVar1 >> 1 != uVar10; uVar10 = uVar10 + 1) {
        pRVar13[uVar10] = pRVar7[uVar10 * 2];
        pRVar13[uVar10 + (local_5c * uVar1 >> 1)] = pRVar7[uVar10 * 2 + 1];
      }
      pRVar13 = pRVar13 + (uVar1 >> 1);
      pRVar7 = pRVar7 + uVar2;
    }
    fwrite(pRVar8,1,(ulong)(local_5c * uVar1),(FILE *)fp);
    break;
  case 3:
  case 6:
  case 7:
  case 0xd:
  case 0xe:
  case 0x10:
switchD_00107b40_caseD_3:
    _mpp_log_l(2,"utils","not supported format %d\n",0,uVar4);
    return;
  case 4:
    pRVar8 = pRVar7;
    uVar4 = local_5c;
    while (bVar14 = uVar4 != 0, uVar4 = uVar4 - 1, bVar14) {
      fwrite(pRVar8,1,uVar10,(FILE *)fp);
      pRVar8 = pRVar8 + uVar2;
    }
    pRVar7 = pRVar7 + iVar3 * uVar2;
    local_5c = local_5c >> 1;
    uVar4 = local_5c;
    while (bVar14 = uVar4 != 0, uVar4 = uVar4 - 1, bVar14) {
      fwrite(pRVar7,1,(ulong)(uVar1 >> 1),(FILE *)fp);
      pRVar7 = pRVar7 + (uVar2 >> 1);
    }
    while (bVar14 = local_5c != 0, local_5c = local_5c - 1, bVar14) {
      fwrite(pRVar7,1,(ulong)(uVar1 >> 1),(FILE *)fp);
      pRVar7 = pRVar7 + (uVar2 >> 1);
    }
    return;
  case 0xc:
    pRVar8 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",local_5c * uVar2);
    while (bVar14 = local_5c != 0, local_5c = local_5c - 1, bVar14) {
      fwrite(pRVar7,1,uVar10,(FILE *)fp);
      pRVar7 = pRVar7 + uVar2;
    }
    break;
  case 0xf:
    pRVar8 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar2 * local_5c * 2);
    pRVar13 = pRVar7;
    uVar4 = local_5c;
    while (bVar14 = uVar4 != 0, uVar4 = uVar4 - 1, bVar14) {
      fwrite(pRVar13,1,uVar10,(FILE *)fp);
      pRVar13 = pRVar13 + uVar2;
    }
    pRVar7 = pRVar7 + iVar3 * uVar2;
    pRVar13 = pRVar8;
    for (uVar4 = 0; uVar4 != local_5c; uVar4 = uVar4 + 1) {
      pRVar11 = pRVar13;
      for (uVar12 = 0; uVar10 * 2 != uVar12; uVar12 = uVar12 + 2) {
        *pRVar11 = pRVar7[uVar12 & 0xffffffff];
        pRVar11[local_5c * uVar1] = pRVar7[(int)uVar12 + 1];
        pRVar11 = pRVar11 + 1;
      }
      pRVar13 = pRVar13 + uVar10;
      pRVar7 = pRVar7 + uVar2 * 2;
    }
    fwrite(pRVar8,1,(ulong)(local_5c * uVar1 * 2),(FILE *)fp);
    break;
  case 0x11:
    pRVar8 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file");
    if (pRVar8 == (RK_U8 *)0x0) goto LAB_00108070;
    pRVar13 = pRVar7 + iVar3 * uVar2;
    uVar1 = uVar1 + 7 >> 3;
    for (uVar4 = 0; uVar4 != local_5c; uVar4 = uVar4 + 1) {
      for (RVar9 = 0; uVar1 != RVar9; RVar9 = RVar9 + 1) {
        rearrange_pix(pRVar8,pRVar7,RVar9);
      }
      fwrite(pRVar8,uVar10 * 2,1,(FILE *)fp);
      pRVar7 = pRVar7 + uVar2;
    }
    for (iVar3 = 0; iVar3 != local_5c * 2; iVar3 = iVar3 + 1) {
      for (RVar9 = 0; uVar1 != RVar9; RVar9 = RVar9 + 1) {
        rearrange_pix(pRVar8,pRVar13,RVar9);
      }
      fwrite(pRVar8,uVar10 * 2,1,(FILE *)fp);
      pRVar13 = pRVar13 + uVar2;
    }
    break;
  default:
    if (5 < uVar5 - 0x10000) {
      if (uVar5 - 0x1000a < 4) {
        pRVar8 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",local_5c * uVar1 * 4);
        while (bVar14 = local_5c != 0, local_5c = local_5c - 1, bVar14) {
          fwrite(pRVar7,1,(ulong)(uVar1 << 2),(FILE *)fp);
          pRVar7 = pRVar7 + uVar2;
        }
      }
      else {
        if (uVar5 != 0x10006) goto switchD_00107b40_caseD_3;
        pRVar8 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",local_5c * uVar1 * 3);
        while (bVar14 = local_5c != 0, local_5c = local_5c - 1, bVar14) {
          fwrite(pRVar7,1,(ulong)(uVar1 * 3),(FILE *)fp);
          pRVar7 = pRVar7 + uVar2;
        }
      }
      break;
    }
  case 8:
  case 9:
  case 10:
  case 0xb:
    pRVar8 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",local_5c * uVar1 * 2);
    while (bVar14 = local_5c != 0, local_5c = local_5c - 1, bVar14) {
      fwrite(pRVar7,1,(ulong)(uVar1 * 2),(FILE *)fp);
      pRVar7 = pRVar7 + uVar2;
    }
  }
  mpp_osal_free("dump_mpp_frame_to_file",pRVar8);
  return;
}

Assistant:

void dump_mpp_frame_to_file(MppFrame frame, FILE *fp)
{
    RK_U32 width    = 0;
    RK_U32 height   = 0;
    RK_U32 h_stride = 0;
    RK_U32 v_stride = 0;
    MppFrameFormat fmt  = MPP_FMT_YUV420SP;
    MppBuffer buffer    = NULL;
    RK_U8 *base = NULL;

    if (NULL == fp || NULL == frame)
        return ;

    width    = mpp_frame_get_width(frame);
    height   = mpp_frame_get_height(frame);
    h_stride = mpp_frame_get_hor_stride(frame);
    v_stride = mpp_frame_get_ver_stride(frame);
    fmt      = mpp_frame_get_fmt(frame);
    buffer   = mpp_frame_get_buffer(frame);

    if (NULL == buffer)
        return ;

    base = (RK_U8 *)mpp_buffer_get_ptr(buffer);

    if (MPP_FRAME_FMT_IS_RGB(fmt) && MPP_FRAME_FMT_IS_LE(fmt)) {
        fmt &= MPP_FRAME_FMT_MASK;
    }
    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV422SP : {
        /* YUV422SP -> YUV422P for better display */
        RK_U32 i, j;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height * 2);
        RK_U8 *tmp_u = tmp;
        RK_U8 *tmp_v = tmp + width * height / 2;

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        for (i = 0; i < height; i++, base_c += h_stride) {
            for (j = 0; j < width / 2; j++) {
                tmp_u[j] = base_c[2 * j + 0];
                tmp_v[j] = base_c[2 * j + 1];
            }
            tmp_u += width / 2;
            tmp_v += width / 2;
        }

        fwrite(tmp, 1, width * height, fp);
        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV420SP_VU :
    case MPP_FMT_YUV420SP : {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;

        for (i = 0; i < height; i++, base_y += h_stride) {
            fwrite(base_y, 1, width, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride) {
            fwrite(base_c, 1, width, fp);
        }
    } break;
    case MPP_FMT_YUV420P : {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;

        for (i = 0; i < height; i++, base_y += h_stride) {
            fwrite(base_y, 1, width, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride / 2) {
            fwrite(base_c, 1, width / 2, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride / 2) {
            fwrite(base_c, 1, width / 2, fp);
        }
    } break;
    case MPP_FMT_YUV420SP_10BIT : {
        RK_U32 i, k;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

        if (!tmp_line) {
            mpp_log("tmp_line malloc fail");
            return;
        }

        for (i = 0; i < height; i++, base_y += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_y, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        for (i = 0; i < height / 2; i++, base_c += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_c, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        MPP_FREE(tmp_line);
    } break;
    case MPP_FMT_YUV444SP : {
        /* YUV444SP -> YUV444P for better display */
        RK_U32 i, j;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height * 2);
        RK_U8 *tmp_u = tmp;
        RK_U8 *tmp_v = tmp + width * height;

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        for (i = 0; i < height; i++, base_c += h_stride * 2) {
            for (j = 0; j < width; j++) {
                tmp_u[j] = base_c[2 * j + 0];
                tmp_v[j] = base_c[2 * j + 1];
            }
            tmp_u += width;
            tmp_v += width;
        }

        fwrite(tmp, 1, width * height * 2, fp);
        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV444SP_10BIT : {
        RK_U32 i, k;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

        if (!tmp_line) {
            mpp_log("tmp_line malloc fail");
            return;
        }

        for (i = 0; i < height; i++, base_y += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_y, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        for (i = 0; i < (height * 2); i++, base_c += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_c, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        MPP_FREE(tmp_line);
    } break;
    case MPP_FMT_YUV400: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_ARGB8888:
    case MPP_FMT_ABGR8888:
    case MPP_FMT_BGRA8888:
    case MPP_FMT_RGBA8888: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 4);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 4, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV422_YUYV:
    case MPP_FMT_YUV422_YVYU:
    case MPP_FMT_YUV422_UYVY:
    case MPP_FMT_YUV422_VYUY:
    case MPP_FMT_RGB565:
    case MPP_FMT_BGR565:
    case MPP_FMT_RGB555:
    case MPP_FMT_BGR555:
    case MPP_FMT_RGB444:
    case MPP_FMT_BGR444: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 2);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 2, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_RGB888: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 3);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 3, fp);

        mpp_free(tmp);
    } break;
    default : {
        mpp_err("not supported format %d\n", fmt);
    } break;
    }
}